

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

void * __thiscall
btDefaultVehicleRaycaster::castRay
          (btDefaultVehicleRaycaster *this,btVector3 *from,btVector3 *to,
          btVehicleRaycasterResult *result)

{
  bool bVar1;
  btRigidBody *this_00;
  btScalar *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  btVector3 *in_RDI;
  btRigidBody *body;
  ClosestRayResultCallback rayCallback;
  btCollisionObject *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  ClosestRayResultCallback *this_01;
  ClosestRayResultCallback local_88;
  btScalar *local_28;
  undefined8 local_20;
  undefined8 local_18;
  btRigidBody *local_8;
  
  this_01 = &local_88;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  btCollisionWorld::ClosestRayResultCallback::ClosestRayResultCallback
            (this_01,in_RDI,
             (btVector3 *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  (**(code **)(**(long **)(in_RDI->m_floats + 2) + 0x40))
            (*(long **)(in_RDI->m_floats + 2),local_18,local_20,this_01);
  bVar1 = btCollisionWorld::RayResultCallback::hasHit(&local_88.super_RayResultCallback);
  if (((bVar1) &&
      (this_00 = btRigidBody::upcast(in_stack_ffffffffffffff28), this_00 != (btRigidBody *)0x0)) &&
     (bVar1 = btCollisionObject::hasContactResponse(&this_00->super_btCollisionObject), bVar1)) {
    *(undefined8 *)local_28 = local_88.m_hitPointWorld.m_floats._0_8_;
    *(undefined8 *)(local_28 + 2) = local_88.m_hitPointWorld.m_floats._8_8_;
    *(undefined8 *)(local_28 + 4) = local_88.m_hitNormalWorld.m_floats._0_8_;
    *(undefined8 *)(local_28 + 6) = local_88.m_hitNormalWorld.m_floats._8_8_;
    btVector3::normalize((btVector3 *)CONCAT17(bVar1,in_stack_ffffffffffffff30));
    local_28[8] = local_88.super_RayResultCallback.m_closestHitFraction;
    local_8 = this_00;
  }
  else {
    local_8 = (btRigidBody *)0x0;
  }
  btCollisionWorld::ClosestRayResultCallback::~ClosestRayResultCallback
            ((ClosestRayResultCallback *)0x2364b8);
  return local_8;
}

Assistant:

void* btDefaultVehicleRaycaster::castRay(const btVector3& from,const btVector3& to, btVehicleRaycasterResult& result)
{
//	RayResultCallback& resultCallback;

	btCollisionWorld::ClosestRayResultCallback rayCallback(from,to);

	m_dynamicsWorld->rayTest(from, to, rayCallback);

	if (rayCallback.hasHit())
	{
		
		const btRigidBody* body = btRigidBody::upcast(rayCallback.m_collisionObject);
        if (body && body->hasContactResponse())
		{
			result.m_hitPointInWorld = rayCallback.m_hitPointWorld;
			result.m_hitNormalInWorld = rayCallback.m_hitNormalWorld;
			result.m_hitNormalInWorld.normalize();
			result.m_distFraction = rayCallback.m_closestHitFraction;
			return (void*)body;
		}
	}
	return 0;
}